

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

bool __thiscall
cmake::SetCacheArgs(cmake *this,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *args)

{
  DiagLevel DVar1;
  cmState *pcVar2;
  bool bVar3;
  bool bVar4;
  size_type sVar5;
  const_reference pvVar6;
  long lVar7;
  ulong uVar8;
  char *pcVar9;
  ostream *poVar10;
  mapped_type *pmVar11;
  DiagLevel *pDVar12;
  reference pbVar13;
  string local_310 [8];
  string path_1;
  string path;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2c8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2c0;
  const_iterator currentEntry;
  iterator iStack_2b0;
  CacheEntryType t;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2a8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2a0;
  const_iterator it;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cacheKeys;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  entriesToDelete;
  undefined1 local_248 [8];
  RegularExpression regex;
  string entryPattern;
  string local_150 [32];
  int local_130;
  byte local_12a;
  byte local_129;
  uint nameStartPosition;
  bool foundError;
  bool foundNo;
  string name;
  string entry_1;
  char *v;
  string cachedValue;
  undefined1 local_b8 [3];
  bool haveValue;
  CacheEntryType type;
  string value;
  string var;
  undefined1 local_68 [8];
  string entry;
  string arg;
  uint i;
  bool findPackageMode;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmake *this_local;
  
  bVar3 = false;
  for (arg.field_2._8_4_ = 1;
      sVar5 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(args), (uint)arg.field_2._8_4_ < sVar5;
      arg.field_2._8_4_ = arg.field_2._8_4_ + 1) {
    pvVar6 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](args,(ulong)(uint)arg.field_2._8_4_);
    std::__cxx11::string::string((string *)(entry.field_2._M_local_buf + 8),(string *)pvVar6);
    lVar7 = std::__cxx11::string::find(entry.field_2._M_local_buf + 8,0x90fcda);
    if (lVar7 == 0) {
      std::__cxx11::string::substr((ulong)local_68,(ulong)((long)&entry.field_2 + 8));
      uVar8 = std::__cxx11::string::empty();
      if ((uVar8 & 1) == 0) {
LAB_00516e89:
        std::__cxx11::string::string((string *)(value.field_2._M_local_buf + 8));
        std::__cxx11::string::string((string *)local_b8);
        cachedValue.field_2._12_4_ = 6;
        bVar4 = cmState::ParseCacheEntry
                          ((string *)local_68,(string *)(value.field_2._M_local_buf + 8),
                           (string *)local_b8,
                           (CacheEntryType *)(cachedValue.field_2._M_local_buf + 0xc));
        if (bVar4) {
          cachedValue.field_2._M_local_buf[0xb] = '\0';
          std::__cxx11::string::string((string *)&v);
          if (((this->WarnUnusedCli & 1U) != 0) &&
             (pcVar9 = cmState::GetInitializedCacheValue
                                 (this->State,(string *)((long)&value.field_2 + 8)),
             pcVar9 != (char *)0x0)) {
            cachedValue.field_2._M_local_buf[0xb] = '\x01';
            std::__cxx11::string::operator=((string *)&v,pcVar9);
          }
          pcVar9 = (char *)std::__cxx11::string::c_str();
          AddCacheEntry(this,(string *)((long)&value.field_2 + 8),pcVar9,
                        "No help, variable specified on the command line.",
                        cachedValue.field_2._12_4_);
          if ((this->WarnUnusedCli & 1U) != 0) {
            if ((cachedValue.field_2._M_local_buf[0xb] & 1U) != 0) {
              pcVar9 = cmState::GetInitializedCacheValue
                                 (this->State,(string *)((long)&value.field_2 + 8));
              bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&v,pcVar9);
              if (!bVar4) goto LAB_0051704c;
            }
            WatchUnusedCli(this,(string *)((long)&value.field_2 + 8));
          }
LAB_0051704c:
          std::__cxx11::string::~string((string *)&v);
          bVar4 = false;
        }
        else {
          poVar10 = std::operator<<((ostream *)&std::cerr,"Parse error in command line argument: ");
          poVar10 = std::operator<<(poVar10,(string *)(entry.field_2._M_local_buf + 8));
          poVar10 = std::operator<<(poVar10,"\n");
          std::operator<<(poVar10,"Should be: VAR:type=value\n");
          cmSystemTools::Error("No cmake script provided.",(char *)0x0,(char *)0x0,(char *)0x0);
          this_local._7_1_ = 0;
          bVar4 = true;
        }
        std::__cxx11::string::~string((string *)local_b8);
        std::__cxx11::string::~string((string *)(value.field_2._M_local_buf + 8));
      }
      else {
        arg.field_2._8_4_ = arg.field_2._8_4_ + 1;
        sVar5 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(args);
        if ((uint)arg.field_2._8_4_ < sVar5) {
          pvVar6 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](args,(ulong)(uint)arg.field_2._8_4_);
          std::__cxx11::string::operator=((string *)local_68,(string *)pvVar6);
          goto LAB_00516e89;
        }
        cmSystemTools::Error
                  ("-D must be followed with VAR=VALUE.",(char *)0x0,(char *)0x0,(char *)0x0);
        this_local._7_1_ = 0;
        bVar4 = true;
      }
      std::__cxx11::string::~string((string *)local_68);
joined_r0x0051752c:
      if (!bVar4) {
LAB_00517bcf:
        bVar4 = false;
      }
    }
    else {
      bVar4 = cmHasLiteralPrefix<std::__cxx11::string,3ul>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&entry.field_2 + 8),(char (*) [3])"-W");
      if (bVar4) {
        std::__cxx11::string::substr
                  ((ulong)((long)&name.field_2 + 8),(ulong)((long)&entry.field_2 + 8));
        uVar8 = std::__cxx11::string::empty();
        if ((uVar8 & 1) == 0) {
LAB_00517229:
          std::__cxx11::string::string((string *)&nameStartPosition);
          local_129 = 0;
          local_12a = 0;
          local_130 = 0;
          lVar7 = std::__cxx11::string::find(name.field_2._M_local_buf + 8,0x8fbf19);
          if (lVar7 == 0) {
            local_129 = 1;
            local_130 = local_130 + 3;
          }
          lVar7 = std::__cxx11::string::find(name.field_2._M_local_buf + 8,0x8fbf1d);
          if (lVar7 == 0) {
            local_12a = 1;
            local_130 = local_130 + 6;
          }
          std::__cxx11::string::substr((ulong)local_150,(ulong)((long)&name.field_2 + 8));
          std::__cxx11::string::operator=((string *)&nameStartPosition,local_150);
          std::__cxx11::string::~string(local_150);
          uVar8 = std::__cxx11::string::empty();
          if ((uVar8 & 1) == 0) {
            if (((local_129 & 1) == 0) && ((local_12a & 1) == 0)) {
              pmVar11 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
                        ::operator[](&this->DiagLevels,(key_type *)&nameStartPosition);
              entryPattern.field_2._12_4_ = 1;
              pDVar12 = std::max<cmake::DiagLevel>
                                  (pmVar11,(DiagLevel *)(entryPattern.field_2._M_local_buf + 0xc));
              DVar1 = *pDVar12;
              pmVar11 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
                        ::operator[](&this->DiagLevels,(key_type *)&nameStartPosition);
              *pmVar11 = DVar1;
            }
            else if (((local_129 & 1) == 0) || ((local_12a & 1) != 0)) {
              if (((local_129 & 1) == 0) && ((local_12a & 1) != 0)) {
                pmVar11 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
                          ::operator[](&this->DiagLevels,(key_type *)&nameStartPosition);
                *pmVar11 = DIAG_ERROR;
              }
              else {
                pmVar11 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
                          ::operator[](&this->DiagLevels,(key_type *)&nameStartPosition);
                entryPattern.field_2._8_4_ = 1;
                pDVar12 = std::min<cmake::DiagLevel>
                                    (pmVar11,(DiagLevel *)(entryPattern.field_2._M_local_buf + 8));
                DVar1 = *pDVar12;
                pmVar11 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
                          ::operator[](&this->DiagLevels,(key_type *)&nameStartPosition);
                *pmVar11 = DVar1;
              }
            }
            else {
              pmVar11 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
                        ::operator[](&this->DiagLevels,(key_type *)&nameStartPosition);
              *pmVar11 = DIAG_IGNORE;
            }
            bVar4 = false;
          }
          else {
            cmSystemTools::Error("No warning name provided.",(char *)0x0,(char *)0x0,(char *)0x0);
            this_local._7_1_ = 0;
            bVar4 = true;
          }
          std::__cxx11::string::~string((string *)&nameStartPosition);
        }
        else {
          arg.field_2._8_4_ = arg.field_2._8_4_ + 1;
          sVar5 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(args);
          if ((uint)arg.field_2._8_4_ < sVar5) {
            pvVar6 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](args,(ulong)(uint)arg.field_2._8_4_);
            std::__cxx11::string::operator=
                      ((string *)(name.field_2._M_local_buf + 8),(string *)pvVar6);
            goto LAB_00517229;
          }
          cmSystemTools::Error
                    ("-W must be followed with [no-]<name>.",(char *)0x0,(char *)0x0,(char *)0x0);
          this_local._7_1_ = 0;
          bVar4 = true;
        }
        std::__cxx11::string::~string((string *)(name.field_2._M_local_buf + 8));
        goto joined_r0x0051752c;
      }
      lVar7 = std::__cxx11::string::find(entry.field_2._M_local_buf + 8,0x8fbf3e);
      if (lVar7 == 0) {
        std::__cxx11::string::substr((ulong)&regex.searchstring,(ulong)((long)&entry.field_2 + 8));
        uVar8 = std::__cxx11::string::empty();
        if ((uVar8 & 1) == 0) {
LAB_00517622:
          cmsys::Glob::PatternToRegex
                    ((string *)
                     &entriesToDelete.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (string *)&regex.searchstring,true,true);
          pcVar9 = (char *)std::__cxx11::string::c_str();
          cmsys::RegularExpression::RegularExpression((RegularExpression *)local_248,pcVar9);
          std::__cxx11::string::~string
                    ((string *)
                     &entriesToDelete.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&cacheKeys.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
          cmState::GetCacheEntryKeys_abi_cxx11_
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&it,this->State);
          local_2a8._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&it);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
          ::__normal_iterator<std::__cxx11::string*>
                    ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                      *)&local_2a0,&local_2a8);
          while( true ) {
            iStack_2b0 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&it);
            bVar4 = __gnu_cxx::operator!=(&local_2a0,&stack0xfffffffffffffd50);
            if (!bVar4) break;
            pcVar2 = this->State;
            pbVar13 = __gnu_cxx::
                      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator*(&local_2a0);
            currentEntry._M_current._4_4_ = cmState::GetCacheEntryType(pcVar2,pbVar13);
            if (currentEntry._M_current._4_4_ != STATIC) {
              __gnu_cxx::
              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator->(&local_2a0);
              pcVar9 = (char *)std::__cxx11::string::c_str();
              bVar4 = cmsys::RegularExpression::find((RegularExpression *)local_248,pcVar9);
              if (bVar4) {
                pbVar13 = __gnu_cxx::
                          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator*(&local_2a0);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&cacheKeys.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,pbVar13);
              }
            }
            __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&local_2a0);
          }
          local_2c8._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&cacheKeys.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
          ::__normal_iterator<std::__cxx11::string*>
                    ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                      *)&local_2c0,&local_2c8);
          while( true ) {
            path.field_2._8_8_ =
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&cacheKeys.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
            bVar4 = __gnu_cxx::operator!=
                              (&local_2c0,
                               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)((long)&path.field_2 + 8));
            if (!bVar4) break;
            pcVar2 = this->State;
            pbVar13 = __gnu_cxx::
                      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator*(&local_2c0);
            cmState::RemoveCacheEntry(pcVar2,pbVar13);
            __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&local_2c0);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&it);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&cacheKeys.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
          cmsys::RegularExpression::~RegularExpression((RegularExpression *)local_248);
          bVar4 = false;
        }
        else {
          arg.field_2._8_4_ = arg.field_2._8_4_ + 1;
          sVar5 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(args);
          if ((uint)arg.field_2._8_4_ < sVar5) {
            pvVar6 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](args,(ulong)(uint)arg.field_2._8_4_);
            std::__cxx11::string::operator=((string *)&regex.searchstring,(string *)pvVar6);
            goto LAB_00517622;
          }
          cmSystemTools::Error("-U must be followed with VAR.",(char *)0x0,(char *)0x0,(char *)0x0);
          this_local._7_1_ = 0;
          bVar4 = true;
        }
        std::__cxx11::string::~string((string *)&regex.searchstring);
        goto joined_r0x0051752c;
      }
      lVar7 = std::__cxx11::string::find(entry.field_2._M_local_buf + 8,0x8fbf5f);
      if (lVar7 == 0) {
        std::__cxx11::string::substr
                  ((ulong)((long)&path_1.field_2 + 8),(ulong)((long)&entry.field_2 + 8));
        uVar8 = std::__cxx11::string::empty();
        if ((uVar8 & 1) == 0) {
LAB_005179d5:
          poVar10 = std::operator<<((ostream *)&std::cout,"loading initial cache file ");
          poVar10 = std::operator<<(poVar10,(string *)(path_1.field_2._M_local_buf + 8));
          std::operator<<(poVar10,"\n");
          pcVar9 = (char *)std::__cxx11::string::c_str();
          ReadListFile(this,args,pcVar9);
          bVar4 = false;
        }
        else {
          arg.field_2._8_4_ = arg.field_2._8_4_ + 1;
          sVar5 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(args);
          if ((uint)arg.field_2._8_4_ < sVar5) {
            pvVar6 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](args,(ulong)(uint)arg.field_2._8_4_);
            std::__cxx11::string::operator=
                      ((string *)(path_1.field_2._M_local_buf + 8),(string *)pvVar6);
            goto LAB_005179d5;
          }
          cmSystemTools::Error
                    ("-C must be followed by a file name.",(char *)0x0,(char *)0x0,(char *)0x0);
          this_local._7_1_ = 0;
          bVar4 = true;
        }
        std::__cxx11::string::~string((string *)(path_1.field_2._M_local_buf + 8));
        goto joined_r0x0051752c;
      }
      lVar7 = std::__cxx11::string::find(entry.field_2._M_local_buf + 8,0x8ee147);
      if (lVar7 != 0) {
        lVar7 = std::__cxx11::string::find(entry.field_2._M_local_buf + 8,0x8ee14a);
        if (lVar7 == 0) {
          bVar3 = true;
        }
        goto LAB_00517bcf;
      }
      arg.field_2._8_4_ = arg.field_2._8_4_ + 1;
      sVar5 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(args);
      if ((uint)arg.field_2._8_4_ < sVar5) {
        pvVar6 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](args,(ulong)(uint)arg.field_2._8_4_);
        std::__cxx11::string::string(local_310,(string *)pvVar6);
        uVar8 = std::__cxx11::string::empty();
        bVar4 = (uVar8 & 1) != 0;
        if (bVar4) {
          cmSystemTools::Error("No cmake script provided.",(char *)0x0,(char *)0x0,(char *)0x0);
          this_local._7_1_ = 0;
        }
        else {
          pcVar9 = (char *)std::__cxx11::string::c_str();
          ReadListFile(this,args,pcVar9);
        }
        std::__cxx11::string::~string(local_310);
        goto joined_r0x0051752c;
      }
      cmSystemTools::Error
                ("-P must be followed by a file name.",(char *)0x0,(char *)0x0,(char *)0x0);
      this_local._7_1_ = 0;
      bVar4 = true;
    }
    std::__cxx11::string::~string((string *)(entry.field_2._M_local_buf + 8));
    if (bVar4) goto LAB_00517c26;
  }
  if (bVar3) {
    this_local._7_1_ = FindPackage(this,args);
  }
  else {
    this_local._7_1_ = 1;
  }
LAB_00517c26:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmake::SetCacheArgs(const std::vector<std::string>& args)
{
  bool findPackageMode = false;
  for(unsigned int i=1; i < args.size(); ++i)
    {
    std::string arg = args[i];
    if(arg.find("-D",0) == 0)
      {
      std::string entry = arg.substr(2);
      if(entry.empty())
        {
        ++i;
        if(i < args.size())
          {
          entry = args[i];
          }
        else
          {
          cmSystemTools::Error("-D must be followed with VAR=VALUE.");
          return false;
          }
        }
      std::string var, value;
      cmState::CacheEntryType type = cmState::UNINITIALIZED;
      if(cmState::ParseCacheEntry(entry, var, value, type))
        {
        // The value is transformed if it is a filepath for example, so
        // we can't compare whether the value is already in the cache until
        // after we call AddCacheEntry.
        bool haveValue = false;
        std::string cachedValue;
        if(this->WarnUnusedCli)
          {
          if(const char *v = this->State->GetInitializedCacheValue(var))
            {
            haveValue = true;
            cachedValue = v;
            }
          }

        this->AddCacheEntry(var, value.c_str(),
          "No help, variable specified on the command line.", type);

        if(this->WarnUnusedCli)
          {
          if (!haveValue ||
              cachedValue != this->State->GetInitializedCacheValue(var))
            {
            this->WatchUnusedCli(var);
            }
          }
        }
      else
        {
        std::cerr << "Parse error in command line argument: " << arg << "\n"
                  << "Should be: VAR:type=value\n";
        cmSystemTools::Error("No cmake script provided.");
        return false;
        }
      }
    else if(cmHasLiteralPrefix(arg, "-W"))
      {
      std::string entry = arg.substr(2);
      if (entry.empty())
        {
        ++i;
        if (i < args.size())
          {
          entry = args[i];
          }
        else
          {
          cmSystemTools::Error("-W must be followed with [no-]<name>.");
          return false;
          }
        }

      std::string name;
      bool foundNo = false;
      bool foundError = false;
      unsigned int nameStartPosition = 0;

      if (entry.find("no-", nameStartPosition) == 0)
        {
        foundNo = true;
        nameStartPosition += 3;
        }

      if (entry.find("error=", nameStartPosition) == 0)
        {
        foundError = true;
        nameStartPosition += 6;
        }

      name = entry.substr(nameStartPosition);
      if (name.empty())
        {
        cmSystemTools::Error("No warning name provided.");
        return false;
        }

      if (!foundNo && !foundError)
        {
        // -W<name>
        this->DiagLevels[name] = std::max(this->DiagLevels[name],
                                          DIAG_WARN);
        }
      else if (foundNo && !foundError)
        {
         // -Wno<name>
         this->DiagLevels[name] = DIAG_IGNORE;
        }
      else if (!foundNo && foundError)
        {
        // -Werror=<name>
        this->DiagLevels[name] = DIAG_ERROR;
        }
      else
        {
        // -Wno-error=<name>
        this->DiagLevels[name] = std::min(this->DiagLevels[name],
                                          DIAG_WARN);
        }
      }
    else if(arg.find("-U",0) == 0)
      {
      std::string entryPattern = arg.substr(2);
      if(entryPattern.empty())
        {
        ++i;
        if(i < args.size())
          {
          entryPattern = args[i];
          }
        else
          {
          cmSystemTools::Error("-U must be followed with VAR.");
          return false;
          }
        }
      cmsys::RegularExpression regex(
        cmsys::Glob::PatternToRegex(entryPattern, true, true).c_str());
      //go through all cache entries and collect the vars which will be removed
      std::vector<std::string> entriesToDelete;
      std::vector<std::string> cacheKeys = this->State->GetCacheEntryKeys();
      for (std::vector<std::string>::const_iterator it = cacheKeys.begin();
            it != cacheKeys.end(); ++it)
        {
        cmState::CacheEntryType t = this->State->GetCacheEntryType(*it);
        if(t != cmState::STATIC)
          {
          if (regex.find(it->c_str()))
            {
            entriesToDelete.push_back(*it);
            }
          }
        }

      // now remove them from the cache
      for(std::vector<std::string>::const_iterator currentEntry =
          entriesToDelete.begin();
          currentEntry != entriesToDelete.end();
          ++currentEntry)
        {
        this->State->RemoveCacheEntry(*currentEntry);
        }
      }
    else if(arg.find("-C",0) == 0)
      {
      std::string path = arg.substr(2);
      if (path.empty())
        {
        ++i;
        if(i < args.size())
          {
          path = args[i];
          }
        else
          {
          cmSystemTools::Error("-C must be followed by a file name.");
          return false;
          }
        }
      std::cout << "loading initial cache file " << path << "\n";
      this->ReadListFile(args, path.c_str());
      }
    else if(arg.find("-P",0) == 0)
      {
      i++;
      if(i >= args.size())
        {
        cmSystemTools::Error("-P must be followed by a file name.");
        return false;
        }
      std::string path = args[i];
      if (path.empty())
        {
        cmSystemTools::Error("No cmake script provided.");
        return false;
        }
      this->ReadListFile(args, path.c_str());
      }
    else if (arg.find("--find-package",0) == 0)
      {
      findPackageMode = true;
      }
    }

  if (findPackageMode)
    {
    return this->FindPackage(args);
    }

  return true;
}